

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFlushFinishTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Functional::anon_unknown_0::FlushFinishCase::iterate(FlushFinishCase *this)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int *piVar3;
  float fVar4;
  TestLog *pTVar5;
  qpWatchDog *dog;
  LineParameters LVar6;
  LineParameters LVar7;
  int iVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  int *piVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  deUint32 dVar16;
  pointer __src;
  undefined4 extraout_var;
  RenderTarget *pRVar17;
  undefined4 extraout_var_00;
  deUint64 dVar18;
  undefined4 extraout_var_01;
  deUint64 dVar19;
  undefined4 extraout_var_02;
  deUint64 dVar20;
  int *__dest;
  size_t sVar21;
  TestError *this_00;
  runtime_error *this_01;
  int iVar22;
  uint uVar23;
  long lVar24;
  char *pcVar25;
  __normal_iterator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample_*,_std::vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>_>
  __i;
  int *piVar26;
  char *__s;
  ulong uVar27;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  value_type *__val;
  uint numDrawCalls;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  float fVar29;
  undefined1 auVar30 [16];
  deUint8 tmp_2 [4];
  ScopedLogSection section;
  size_type __dnew;
  size_type __dnew_6;
  size_type __dnew_1;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> readTimes;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> waitTimes;
  deUint8 tmp [4];
  size_type __dnew_7;
  float local_4f8;
  float fStack_4f4;
  undefined8 local_4e8;
  float fStack_4d4;
  LogNumber<float> local_4b8;
  string local_450;
  vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  local_430;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  LogNumber<float> local_378;
  string local_310;
  LogNumber<float> local_2f0;
  string local_288;
  string local_268;
  string local_248;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_228;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_210;
  undefined1 local_1f8 [8];
  _func_int **pp_Stack_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  _Alloc_hider local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Alloc_hider local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  qpKeyValueTag local_198;
  float local_194;
  deInt64 local_190;
  ios_base local_180 [272];
  string local_70;
  string local_50;
  
  __src = (pointer)operator_new(600);
  local_430.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish = __src + 0x19;
  *(undefined8 *)__src = 0;
  __src->waitTime = 0;
  __src->readPixelsTime = 0;
  lVar24 = 0x18;
  do {
    *(deUint64 *)((long)&__src->readPixelsTime + lVar24) = __src->readPixelsTime;
    dVar18 = __src->waitTime;
    puVar1 = (undefined8 *)((long)&__src->numDrawCalls + lVar24);
    *puVar1 = *(undefined8 *)__src;
    puVar1[1] = dVar18;
    lVar24 = lVar24 + 0x18;
  } while (lVar24 != 600);
  local_430.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = __src;
  local_430.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_430.
       super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  tcu::warmupCPU();
  iVar14 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar24 = CONCAT44(extraout_var,iVar14);
  iVar15 = (**(code **)(lVar24 + 0x780))((this->m_program->m_program).m_program);
  pRVar17 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar14 = pRVar17->m_width;
  pRVar17 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (iVar15 < 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"posLoc >= 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fFlushFinishTests.cpp"
               ,0xe9);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar22 = pRVar17->m_height;
  if (0x7f < iVar22) {
    iVar22 = 0x80;
  }
  iVar8 = 0x80;
  if (iVar14 < 0x80) {
    iVar8 = iVar14;
  }
  (**(code **)(lVar24 + 0x1a00))(0,0,iVar8,iVar22);
  (**(code **)(lVar24 + 0x1680))((this->m_program->m_program).m_program);
  (**(code **)(lVar24 + 0x610))(iVar15);
  (**(code **)(lVar24 + 0x19f0))
            (iVar15,2,0x1406,0,0,
             Functional::(anonymous_namespace)::FlushFinishCase::setupRenderState()::s_positions);
  (**(code **)(lVar24 + 0x5e0))(0xbe2);
  (**(code **)(lVar24 + 0x120))(1,1);
  (**(code **)(lVar24 + 0x100))(0x8006);
  dVar16 = (**(code **)(lVar24 + 0x800))();
  glu::checkError(dVar16,"Failed to set up render state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fFlushFinishTests.cpp"
                  ,0xf2);
  render((FlushFinishCase *)((this->super_TestCase).m_context)->m_renderCtx,1);
  iVar14 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_00,iVar14) + 0x1220))(0,0,1,1,0x1908,0x1401,local_1f8);
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1f8 = (undefined1  [8])&local_1e8;
  local_1e8._M_allocated_capacity._0_4_ = 0x696c6143;
  local_1e8._M_allocated_capacity._4_4_ = 0x74617262;
  local_1e8._8_7_ = 0x6f666e496e6f69;
  pp_Stack_1f0 = (_func_int **)0xf;
  local_1e8._M_local_buf[0xf] = '\0';
  paVar2 = &local_4b8.m_name.field_2;
  local_378.m_name._M_dataplus._M_p = &DAT_00000010;
  local_4b8.m_name._M_dataplus._M_p = (pointer)paVar2;
  local_4b8.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_4b8,(ulong)&local_378);
  local_4b8.m_name.field_2._M_allocated_capacity = (size_type)local_378.m_name._M_dataplus._M_p;
  builtin_strncpy(local_4b8.m_name._M_dataplus._M_p,"Calibration info",0x10);
  local_4b8.m_name._M_string_length = (size_type)local_378.m_name._M_dataplus._M_p;
  local_4b8.m_name._M_dataplus._M_p[(long)local_378.m_name._M_dataplus._M_p] = '\0';
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_3f8,pTVar5,(string *)local_1f8,&local_4b8.m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_4b8.m_name._M_dataplus._M_p,
                    (ulong)(local_4b8.m_name.field_2._M_allocated_capacity + 1));
  }
  if (local_1f8 != (undefined1  [8])&local_1e8) {
    operator_delete((void *)local_1f8,
                    CONCAT44(local_1e8._M_allocated_capacity._4_4_,
                             local_1e8._M_allocated_capacity._0_4_) + 1);
  }
  local_1f8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1f0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1f0,"Calibrating maximum draw call count, target duration = ",0x37
            );
  std::ostream::operator<<((ostringstream *)&pp_Stack_1f0,1000000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1f0," us",3);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1f0);
  std::ios_base::~ios_base(local_180);
  local_4e8 = 0;
  local_4f8 = 1.4013e-45;
  uVar23 = 1;
  while( true ) {
    numDrawCalls = uVar23;
    dVar18 = deGetMicroseconds();
    render((FlushFinishCase *)((this->super_TestCase).m_context)->m_renderCtx,numDrawCalls);
    iVar14 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_01,iVar14) + 0x1220))
              (0,0,1,1,0x1908,0x1401,(MessageBuilder *)local_1f8);
    dVar19 = deGetMicroseconds();
    local_1f8 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1f0,"Duration with ",0xe);
    std::ostream::operator<<((ostringstream *)&pp_Stack_1f0,numDrawCalls);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1f0," draw calls = ",0xe);
    uVar27 = dVar19 - dVar18;
    std::ostream::_M_insert<unsigned_long>((ulong)&pp_Stack_1f0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1f0," us",3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1f0);
    std::ios_base::~ios_base(local_180);
    if (1000000 < uVar27) break;
    if (0xfffff < (int)numDrawCalls) goto LAB_00fc5b93;
    uVar23 = numDrawCalls * 2;
    local_4f8 = (float)numDrawCalls;
    local_4e8 = uVar27;
  }
  if (1 < (int)numDrawCalls) {
    fVar29 = (float)(uVar27 - local_4e8) / (float)(int)(numDrawCalls - (int)local_4f8);
    fVar29 = floorf((1e+06 - ((float)(long)local_4e8 - (float)(int)local_4f8 * fVar29)) / fVar29);
    uVar23 = 0x100000;
    if ((int)fVar29 < 0x100000) {
      uVar23 = (int)fVar29;
    }
    numDrawCalls = 1;
    if (1 < (int)uVar23) {
      numDrawCalls = uVar23;
    }
  }
LAB_00fc5b93:
  paVar28 = &local_4b8.m_name.field_2;
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_4b8.m_name.field_2._M_allocated_capacity = 0x437761724478614d;
  local_4b8.m_name.field_2._8_4_ = 0x736c6c61;
  local_4b8.m_name._M_string_length = 0xc;
  local_4b8.m_name.field_2._M_local_buf[0xc] = '\0';
  paVar2 = &local_378.m_name.field_2;
  local_2f0.m_name._M_dataplus._M_p = (pointer)0x1c;
  local_4b8.m_name._M_dataplus._M_p = (pointer)paVar28;
  local_378.m_name._M_dataplus._M_p = (pointer)paVar2;
  local_378.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_378,(ulong)&local_2f0);
  local_378.m_name.field_2._M_allocated_capacity = (size_type)local_2f0.m_name._M_dataplus._M_p;
  builtin_strncpy((char *)((long)((long)local_378.m_name._M_dataplus._M_p + 8) + 4),"er of dr",8);
  builtin_strncpy((char *)((long)((long)local_378.m_name._M_dataplus._M_p + 0x10) + 4),"aw calls",8)
  ;
  *(undefined8 *)local_378.m_name._M_dataplus._M_p = 0x206d756d6978614d;
  *(undefined8 *)((long)local_378.m_name._M_dataplus._M_p + 8) = 0x6f207265626d756e;
  local_378.m_name._M_string_length = (size_type)local_2f0.m_name._M_dataplus._M_p;
  local_2f0.m_name._M_dataplus._M_p[(long)local_378.m_name._M_dataplus._M_p] = '\0';
  local_2f0.m_name._M_string_length = 0;
  local_2f0.m_name.field_2._M_local_buf[0] = '\0';
  local_2f0.m_name._M_dataplus._M_p = (pointer)&local_2f0.m_name.field_2;
  tcu::LogNumber<long>::LogNumber
            ((LogNumber<long> *)local_1f8,&local_4b8.m_name,&local_378.m_name,&local_2f0.m_name,
             QP_KEY_TAG_NONE,(long)(int)numDrawCalls);
  tcu::TestLog::writeInteger
            (pTVar5,(char *)local_1f8,local_1d8._M_p,local_1b8._M_p,local_198,local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_p != &local_1a8) {
    operator_delete(local_1b8._M_p,local_1a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_p != &local_1c8) {
    operator_delete(local_1d8._M_p,local_1c8._M_allocated_capacity + 1);
  }
  if (local_1f8 != (undefined1  [8])&local_1e8) {
    operator_delete((void *)local_1f8,
                    CONCAT44(local_1e8._M_allocated_capacity._4_4_,
                             local_1e8._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_name._M_dataplus._M_p != &local_2f0.m_name.field_2) {
    operator_delete(local_2f0.m_name._M_dataplus._M_p,
                    CONCAT71(local_2f0.m_name.field_2._M_allocated_capacity._1_7_,
                             local_2f0.m_name.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_378.m_name._M_dataplus._M_p,
                    local_378.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8.m_name._M_dataplus._M_p != paVar28) {
    operator_delete(local_4b8.m_name._M_dataplus._M_p,
                    local_4b8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((int)numDrawCalls < 10) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1f8 = (undefined1  [8])&local_1e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f8,"Calibration failed, maximum draw call count is too low","");
    std::runtime_error::runtime_error(this_01,(string *)local_1f8);
    *(undefined ***)this_01 = &PTR__runtime_error_02127990;
    __cxa_throw(this_01,&Functional::(anonymous_namespace)::CalibrationFailedException::typeinfo,
                std::runtime_error::~runtime_error);
  }
  tcu::TestLog::endSection((TestLog *)local_3f8._M_dataplus._M_p);
  deRandom_init((deRandom *)local_1f8,0x7b);
  lVar24 = 0x10;
  do {
    dVar16 = deRandom_getUint32((deRandom *)local_1f8);
    iVar15 = dVar16 % numDrawCalls + 1;
    render((FlushFinishCase *)((this->super_TestCase).m_context)->m_renderCtx,iVar15);
    dVar18 = deGetMicroseconds();
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
    dVar19 = deGetMicroseconds();
    iVar14 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_02,iVar14) + 0x1220))(0,0,1,1,0x1908,0x1401,&local_4b8);
    dVar20 = deGetMicroseconds();
    *(int *)((long)__src + lVar24 + -0x10) = iVar15;
    *(deUint64 *)((long)__src + lVar24 + -8) = dVar19 - dVar18;
    *(deUint64 *)((long)&__src->numDrawCalls + lVar24) = dVar20 - dVar19;
    dog = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_watchDog;
    if (dog != (qpWatchDog *)0x0) {
      qpWatchDog_touch(dog);
    }
    lVar24 = lVar24 + 0x18;
  } while (lVar24 != 0x268);
  getPointsFromSamples(&local_210,&local_430,8);
  paVar2 = &local_4b8.m_name.field_2;
  getPointsFromSamples(&local_228,&local_430,0x10);
  LVar6 = deqp::gls::theilSenLinearRegression(&local_210);
  LVar7 = deqp::gls::theilSenLinearRegression(&local_228);
  local_1f8 = (undefined1  [8])&local_1e8;
  local_1e8._M_allocated_capacity._0_4_ = 0x706d6153;
  pp_Stack_1f0 = (_func_int **)0x7;
  local_1e8._M_allocated_capacity._4_4_ = 0x73656c;
  local_4b8.m_name._M_string_length = 7;
  local_4b8.m_name.field_2._M_allocated_capacity = 0x73656c706d6153;
  local_4b8.m_name._M_dataplus._M_p = (pointer)paVar2;
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_378,
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
             (string *)local_1f8,&local_4b8.m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_4b8.m_name._M_dataplus._M_p,
                    local_4b8.m_name.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8 != (undefined1  [8])&local_1e8) {
    operator_delete((void *)local_1f8,
                    CONCAT44(local_1e8._M_allocated_capacity._4_4_,
                             local_1e8._M_allocated_capacity._0_4_) + 1);
  }
  __dest = (int *)operator_new(600);
  fVar29 = (float)(int)numDrawCalls;
  fStack_4d4 = LVar7.coefficient;
  local_4e8._4_4_ = LVar6.coefficient;
  auVar30._0_4_ = fVar29 * local_4e8._4_4_;
  auVar30._4_4_ = fVar29 * fStack_4d4;
  auVar30._8_4_ = fVar29 * extraout_XMM0_Dc;
  auVar30._12_4_ = fVar29 * extraout_XMM0_Dd;
  auVar30 = divps(auVar30,_DAT_01bd3930);
  memcpy(__dest,__src,600);
  piVar3 = __dest + 0x96;
  std::
  __introsort_loop<__gnu_cxx::__normal_iterator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample*,std::vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles2::Functional::(anonymous_namespace)::CompareSampleDrawCount>>
            (__dest,piVar3,8);
  piVar26 = __dest + 0x60;
  std::
  __insertion_sort<__gnu_cxx::__normal_iterator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample*,std::vector<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>>>,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles2::Functional::(anonymous_namespace)::CompareSampleDrawCount>>
            (__dest,piVar26);
  do {
    iVar14 = *piVar26;
    local_1e8._M_allocated_capacity._0_4_ = piVar26[5];
    uVar9 = *(undefined8 *)(piVar26 + 1);
    pp_Stack_1f0 = *(_func_int ***)(piVar26 + 3);
    iVar15 = piVar26[-6];
    piVar12 = piVar26;
    while (iVar14 < iVar15) {
      *(undefined8 *)(piVar12 + 4) = *(undefined8 *)(piVar12 + -2);
      *(undefined8 *)piVar12 = *(undefined8 *)(piVar12 + -6);
      *(undefined8 *)(piVar12 + 2) = *(undefined8 *)(piVar12 + -4);
      iVar15 = piVar12[-0xc];
      piVar12 = piVar12 + -6;
    }
    *piVar12 = iVar14;
    *(undefined8 *)(piVar12 + 1) = uVar9;
    *(_func_int ***)(piVar12 + 3) = pp_Stack_1f0;
    piVar12[5] = local_1e8._M_allocated_capacity._0_4_;
    piVar26 = piVar26 + 6;
  } while (piVar26 != piVar3);
  piVar26 = __dest;
  do {
    local_1f8 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1f0);
    std::ostream::operator<<((ostringstream *)&pp_Stack_1f0,*piVar26);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1f0," calls:\t",8);
    std::ostream::_M_insert<unsigned_long>((ulong)&pp_Stack_1f0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1f0," us wait,\t",10);
    std::ostream::_M_insert<unsigned_long>((ulong)&pp_Stack_1f0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1f0," us read",8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1f0);
    std::ios_base::~ios_base(local_180);
    piVar26 = piVar26 + 6;
  } while (piVar26 != piVar3);
  operator_delete(__dest,600);
  tcu::TestLog::endSection((TestLog *)local_378.m_name._M_dataplus._M_p);
  pTVar5 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  local_3f8.field_2._M_allocated_capacity._0_7_ = 0x656f4374696157;
  local_3f8.field_2._M_local_buf[7] = 'f';
  local_3f8.field_2._8_7_ = 0x746e6569636966;
  local_3f8._M_string_length = 0xf;
  local_3f8.field_2._M_local_buf[0xf] = '\0';
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  local_4b8.m_name._M_dataplus._M_p = &DAT_00000010;
  local_398._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_398,(ulong)&local_4b8);
  local_398.field_2._M_allocated_capacity = (size_type)local_4b8.m_name._M_dataplus._M_p;
  builtin_strncpy(local_398._M_dataplus._M_p,"Wait coefficient",0x10);
  local_398._M_string_length = (size_type)local_4b8.m_name._M_dataplus._M_p;
  local_398._M_dataplus._M_p[(long)local_4b8.m_name._M_dataplus._M_p] = '\0';
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_248._M_string_length = 0;
  local_248.field_2._M_local_buf[0] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_1f8,&local_3f8,&local_398,&local_248,QP_KEY_TAG_NONE,
             local_4e8._4_4_);
  tcu::TestLog::writeFloat
            (pTVar5,(char *)local_1f8,local_1d8._M_p,local_1b8._M_p,local_198,local_194);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  local_268.field_2._M_allocated_capacity._0_7_ = 0x656f4364616552;
  local_268.field_2._M_local_buf[7] = 'f';
  local_268.field_2._8_7_ = 0x746e6569636966;
  local_268._M_string_length = 0xf;
  local_268.field_2._M_local_buf[0xf] = '\0';
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  local_378.m_name._M_dataplus._M_p = &DAT_00000010;
  local_3b8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_3b8,(ulong)&local_378);
  local_3b8.field_2._M_allocated_capacity = (size_type)local_378.m_name._M_dataplus._M_p;
  builtin_strncpy(local_3b8._M_dataplus._M_p,"Read coefficient",0x10);
  local_3b8._M_string_length = (size_type)local_378.m_name._M_dataplus._M_p;
  local_3b8._M_dataplus._M_p[(long)local_378.m_name._M_dataplus._M_p] = '\0';
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  local_288._M_string_length = 0;
  local_288.field_2._M_local_buf[0] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_4b8,&local_268,&local_3b8,&local_288,QP_KEY_TAG_NONE,fStack_4d4);
  tcu::TestLog::writeFloat
            (pTVar5,local_4b8.m_name._M_dataplus._M_p,local_4b8.m_desc._M_dataplus._M_p,
             local_4b8.m_unit._M_dataplus._M_p,local_4b8.m_tag,local_4b8.m_value);
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  local_2f0.m_name._M_dataplus._M_p = (pointer)0x19;
  local_450._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_450,(ulong)&local_2f0);
  local_450.field_2._M_allocated_capacity = (size_type)local_2f0.m_name._M_dataplus._M_p;
  builtin_strncpy(local_450._M_dataplus._M_p,"NormalizedWaitCoefficient",0x19);
  local_450._M_string_length = (size_type)local_2f0.m_name._M_dataplus._M_p;
  local_450._M_dataplus._M_p[(long)local_2f0.m_name._M_dataplus._M_p] = '\0';
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  local_2f0.m_name._M_dataplus._M_p = (char *)0x1b;
  local_3d8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_3d8,(ulong)&local_2f0);
  local_3d8.field_2._M_allocated_capacity = (size_type)local_2f0.m_name._M_dataplus._M_p;
  builtin_strncpy(local_3d8._M_dataplus._M_p,"Normalized wait coefficient",0x1b);
  local_3d8._M_string_length = (size_type)local_2f0.m_name._M_dataplus._M_p;
  local_3d8._M_dataplus._M_p[(long)local_2f0.m_name._M_dataplus._M_p] = '\0';
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_4f8 = auVar30._0_4_;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  tcu::LogNumber<float>::LogNumber
            (&local_378,&local_450,&local_3d8,&local_50,QP_KEY_TAG_NONE,local_4f8);
  tcu::TestLog::writeFloat
            (pTVar5,local_378.m_name._M_dataplus._M_p,local_378.m_desc._M_dataplus._M_p,
             local_378.m_unit._M_dataplus._M_p,local_378.m_tag,local_378.m_value);
  local_310._M_dataplus._M_p = (pointer)0x19;
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  local_418._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_418,(ulong)&local_310);
  local_418.field_2._M_allocated_capacity = (size_type)local_310._M_dataplus._M_p;
  builtin_strncpy(local_418._M_dataplus._M_p,"NormalizedReadCoefficient",0x19);
  local_418._M_string_length = (size_type)local_310._M_dataplus._M_p;
  local_418._M_dataplus._M_p[(long)local_310._M_dataplus._M_p] = '\0';
  local_70._M_dataplus._M_p = (pointer)0x1b;
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  local_310._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_310,(ulong)&local_70);
  local_310.field_2._M_allocated_capacity = (size_type)local_70._M_dataplus._M_p;
  builtin_strncpy(local_310._M_dataplus._M_p,"Normalized read coefficient",0x1b);
  local_310._M_string_length = (size_type)local_70._M_dataplus._M_p;
  local_310._M_dataplus._M_p[(long)local_70._M_dataplus._M_p] = '\0';
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  fStack_4f4 = auVar30._4_4_;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  tcu::LogNumber<float>::LogNumber
            (&local_2f0,&local_418,&local_310,&local_70,QP_KEY_TAG_NONE,fStack_4f4);
  tcu::TestLog::writeFloat
            (pTVar5,local_2f0.m_name._M_dataplus._M_p,local_2f0.m_desc._M_dataplus._M_p,
             local_2f0.m_unit._M_dataplus._M_p,local_2f0.m_tag,local_2f0.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_unit._M_dataplus._M_p != &local_2f0.m_unit.field_2) {
    operator_delete(local_2f0.m_unit._M_dataplus._M_p,
                    local_2f0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_desc._M_dataplus._M_p != &local_2f0.m_desc.field_2) {
    operator_delete(local_2f0.m_desc._M_dataplus._M_p,
                    local_2f0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0.m_name._M_dataplus._M_p != &local_2f0.m_name.field_2) {
    operator_delete(local_2f0.m_name._M_dataplus._M_p,
                    CONCAT71(local_2f0.m_name.field_2._M_allocated_capacity._1_7_,
                             local_2f0.m_name.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,(ulong)(local_418.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378.m_unit._M_dataplus._M_p != &local_378.m_unit.field_2) {
    operator_delete(local_378.m_unit._M_dataplus._M_p,
                    local_378.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378.m_desc._M_dataplus._M_p != &local_378.m_desc.field_2) {
    operator_delete(local_378.m_desc._M_dataplus._M_p,
                    local_378.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378.m_name._M_dataplus._M_p != &local_378.m_name.field_2) {
    operator_delete(local_378.m_name._M_dataplus._M_p,
                    local_378.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,(ulong)(local_3d8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,(ulong)(local_450.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8.m_unit._M_dataplus._M_p != &local_4b8.m_unit.field_2) {
    operator_delete(local_4b8.m_unit._M_dataplus._M_p,
                    local_4b8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8.m_desc._M_dataplus._M_p != &local_4b8.m_desc.field_2) {
    operator_delete(local_4b8.m_desc._M_dataplus._M_p,
                    local_4b8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8.m_name._M_dataplus._M_p != &local_4b8.m_name.field_2) {
    operator_delete(local_4b8.m_name._M_dataplus._M_p,
                    local_4b8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,
                    CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                             local_288.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,(ulong)(local_3b8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT17(local_268.field_2._M_local_buf[7],
                             local_268.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_p != &local_1a8) {
    operator_delete(local_1b8._M_p,local_1a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_p != &local_1c8) {
    operator_delete(local_1d8._M_p,local_1c8._M_allocated_capacity + 1);
  }
  if (local_1f8 != (undefined1  [8])&local_1e8) {
    operator_delete((void *)local_1f8,
                    CONCAT44(local_1e8._M_allocated_capacity._4_4_,
                             local_1e8._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p,(ulong)(local_398.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,
                    CONCAT17(local_3f8.field_2._M_local_buf[7],
                             local_3f8.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((0.5 < local_4f8) || (local_4f8 < 0.1)) {
    local_1f8 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1f0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1f0,"Wait time is",0xc);
    pcVar25 = " NOT";
    if (0.5 < local_4f8) {
      pcVar25 = glcts::fixed_sample_locations_values + 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1f0,pcVar25,(ulong)(local_4f8 <= 0.5) << 2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1f0," correlated to rendering workload size.",0x27);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_1f8 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1f0,
               "Warning: Wait time correlation to rendering workload size is unclear.",0x45);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1f0);
  std::ios_base::~ios_base(local_180);
  if ((0.5 < fStack_4f4) || (fStack_4f4 < 0.1)) {
    local_1f8 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1f0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1f0,"Read time is",0xc);
    pcVar25 = " NOT";
    if (0.5 < fStack_4f4) {
      pcVar25 = glcts::fixed_sample_locations_values + 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1f0,pcVar25,(ulong)(fStack_4f4 <= 0.5) << 2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1f0," correlated to rendering workload size.",0x27);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_1f8 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1f0,
               "Warning: Read time correlation to rendering workload size is unclear.",0x45);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1f0);
  std::ios_base::~ios_base(local_180);
  bVar13 = true;
  bVar10 = true;
  do {
    fVar29 = local_4f8;
    if (!bVar10) {
      fVar29 = fStack_4f4;
    }
    pcVar25 = "render and read";
    if (bVar10) {
      pcVar25 = "Finish and wait";
    }
    fVar4 = (&this->m_waitThreshold)[(ulong)(byte)~bVar10 * 2];
    if ((&this->m_waitBehavior)[(ulong)(byte)~bVar10 * 2] == EXPECT_COEF_GREATER_THAN) {
      __s = "greater than";
      if (fVar29 <= fVar4) goto LAB_00fc6b5a;
    }
    else {
      __s = "less than";
      if ((&this->m_waitBehavior)[(ulong)(byte)~bVar10 * 2] == EXPECT_COEF_LESS_THAN) {
        if (fVar29 < fVar4) goto LAB_00fc6c42;
      }
      else {
        __s = (char *)0x0;
      }
LAB_00fc6b5a:
      local_1f8 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1f0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pp_Stack_1f0,"ERROR: Expected ",0x10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1f0,pcVar25 + 0xb,4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pp_Stack_1f0," coefficient to be ",0x13);
      if (__s == (char *)0x0) {
        std::ios::clear((int)(ostringstream *)&pp_Stack_1f0 + (int)pp_Stack_1f0[-3]);
      }
      else {
        sVar21 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1f0,__s,sVar21);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1f0," ",1);
      std::ostream::_M_insert<double>((double)fVar4);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1f0);
      std::ios_base::~ios_base(local_180);
      bVar13 = false;
    }
LAB_00fc6c42:
    bVar11 = !bVar10;
    bVar10 = false;
    if (bVar11) {
      pcVar25 = "Suspicious performance behavior";
      if (bVar13) {
        pcVar25 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (byte)~bVar13 & QP_TEST_RESULT_FAIL,pcVar25);
      if (local_228.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_210.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_210.
                        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_210.
                              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_210.
                              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_430.
          super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_430.
                        super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_430.
                              super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_430.
                              super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return STOP;
    }
  } while( true );
}

Assistant:

FlushFinishCase::IterateResult FlushFinishCase::iterate (void)
{
	vector<Sample>		samples		(NUM_SAMPLES);
	CalibrationParams	params;

	tcu::warmupCPU();

	setupRenderState();

	// Do one full render cycle.
	{
		render(1);
		readPixels();
	}

	// Calibrate.
	try
	{
		params = calibrate();
	}
	catch (const CalibrationFailedException& e)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, e.what());
		return STOP;
	}

	// Do measurement.
	{
		de::Random	rnd		(123);

		for (size_t ndx = 0; ndx < samples.size(); ndx++)
		{
			const int	drawCallCount	= rnd.getInt(1, params.maxDrawCalls);
			deUint64	waitStartTime;
			deUint64	readStartTime;
			deUint64	readFinishTime;

			render(drawCallCount);

			waitStartTime = deGetMicroseconds();
			waitForGL();

			readStartTime = deGetMicroseconds();
			readPixels();
			readFinishTime = deGetMicroseconds();

			samples[ndx].numDrawCalls	= drawCallCount;
			samples[ndx].waitTime		= readStartTime-waitStartTime;
			samples[ndx].readPixelsTime	= readFinishTime-readStartTime;

			if (m_testCtx.getWatchDog())
				qpWatchDog_touch(m_testCtx.getWatchDog());
		}
	}

	// Analyze - sets test case result.
	analyzeResults(samples, params);

	return STOP;
}